

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  bool bVar1;
  bool in_DL;
  string sStack_38;
  
  bVar1 = (bool)**(byte **)this;
  to_string_abi_cxx11_(&sStack_38,(lest *)(ulong)bVar1,in_DL);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->decomposition,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }